

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManage.cpp
# Opt level: O0

void init_memory_manager(void)

{
  MemoryNode *pMVar1;
  MemoryNode *first_free;
  
  code_used_memory_head = (MemoryNode *)operator_new(0x20);
  data_used_memory_head = (MemoryNode *)operator_new(0x20);
  code_free_memory_head = (MemoryNode *)operator_new(0x20);
  data_free_memory_head = (MemoryNode *)operator_new(0x20);
  clear_node(code_free_memory_head);
  clear_node(data_free_memory_head);
  clear_node(code_used_memory_head);
  clear_node(data_used_memory_head);
  pMVar1 = (MemoryNode *)operator_new(0x20);
  pMVar1->address = 0;
  pMVar1->size = 0xffff;
  pMVar1->forward = data_free_memory_head;
  pMVar1->next = (MemoryNode *)0x0;
  data_free_memory_head->next = pMVar1;
  pMVar1 = (MemoryNode *)operator_new(0x20);
  pMVar1->address = 0;
  pMVar1->size = 0xffff;
  pMVar1->forward = code_free_memory_head;
  pMVar1->next = (MemoryNode *)0x0;
  code_free_memory_head->next = pMVar1;
  data_used_memory_head->address = 0xffffffff;
  data_used_memory_head->size = 0xffffffff;
  code_used_memory_head->address = 0xffffffff;
  code_used_memory_head->size = 0xffffffff;
  return;
}

Assistant:

void init_memory_manager() {
	code_used_memory_head = new MemoryNode;
	data_used_memory_head = new MemoryNode;
	code_free_memory_head = new MemoryNode;
	data_free_memory_head = new MemoryNode;
	clear_node(code_free_memory_head);
	clear_node(data_free_memory_head);
	clear_node(code_used_memory_head);
	clear_node(data_used_memory_head);

	/*创建空闲的数据段节点*/
	MemoryNode* first_free = new MemoryNode;
	first_free->address = 0;
	first_free->size = 0xffff;
	first_free->forward = data_free_memory_head;
	first_free->next = nullptr;
	data_free_memory_head->next = first_free;

	/*创建空闲的代码段段节点*/
	first_free = new MemoryNode;
	first_free->address = 0;
	first_free->size = 0xffff;
	first_free->forward = code_free_memory_head;
	first_free->next = nullptr;
	code_free_memory_head->next = first_free;

	data_used_memory_head->address = -1;
	data_used_memory_head->size = -1;
	code_used_memory_head->address = -1;
	code_used_memory_head->size = -1;
}